

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float __thiscall
ImGui::ScaleRatioFromValueT<unsigned_long_long,long_long,double>
          (ImGui *this,ImGuiDataType data_type,unsigned_long_long v,unsigned_long_long v_min,
          unsigned_long_long v_max,bool is_logarithmic,float logarithmic_zero_epsilon,
          float zero_deadzone_halfsize)

{
  ulong uVar1;
  long lVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  undefined4 in_register_00000034;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 in_register_00001204 [60];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  
  fVar7 = 0.0;
  lVar2 = v_min - v;
  if (lVar2 != 0) {
    uVar4 = v_min;
    if (v_min >= v && lVar2 != 0) {
      uVar4 = v;
    }
    uVar1 = v_min;
    if (v_min < v) {
      uVar1 = v;
    }
    if (CONCAT44(in_register_00000034,data_type) < uVar1) {
      uVar1 = CONCAT44(in_register_00000034,data_type);
    }
    if (CONCAT44(in_register_00000034,data_type) <= uVar4 &&
        uVar4 != CONCAT44(in_register_00000034,data_type)) {
      uVar1 = uVar4;
    }
    if ((char)v_max == '\0') {
      fVar7 = (float)((double)(long)(uVar1 - v) / (double)lVar2);
    }
    else {
      uVar4 = v;
      if (v_min < v) {
        uVar4 = v_min;
      }
      uVar3 = v;
      if (v < v_min) {
        uVar3 = v_min;
      }
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar4;
      auVar8 = vpunpckldq_avx(auVar8,ZEXT816(0x4530000043300000));
      auVar8 = vsubpd_avx(auVar8,_DAT_001e3e20);
      auVar9._0_8_ = auVar8._0_8_ + auVar8._8_8_;
      auVar9._8_8_ = auVar8._0_8_ + auVar8._8_8_;
      auVar6._0_8_ = (double)logarithmic_zero_epsilon;
      auVar6._8_8_ = in_register_00001204._4_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar1;
      auVar8 = vpunpckldq_avx(auVar13,ZEXT816(0x4530000043300000));
      auVar8 = vsubpd_avx(auVar8,_DAT_001e3e20);
      dVar12 = auVar8._0_8_ + auVar8._8_8_;
      auVar8 = vmaxsd_avx(auVar6,auVar9);
      fVar7 = 0.0;
      dVar5 = auVar8._0_8_;
      if (dVar5 < dVar12) {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar3;
        auVar8 = vpunpckldq_avx(auVar10,ZEXT816(0x4530000043300000));
        auVar8 = vsubpd_avx(auVar8,_DAT_001e3e20);
        auVar11._0_8_ = auVar8._0_8_ + auVar8._8_8_;
        auVar11._8_8_ = auVar8._0_8_ + auVar8._8_8_;
        auVar8 = vmaxsd_avx(auVar6,auVar11);
        if (auVar8._0_8_ <= dVar12) {
          fVar7 = 1.0;
        }
        else {
          dVar12 = log(dVar12 / dVar5);
          dVar5 = log(auVar8._0_8_ / dVar5);
          fVar7 = (float)(dVar12 / dVar5);
        }
      }
      if (v_min < v) {
        fVar7 = 1.0 - fVar7;
      }
    }
  }
  return fVar7;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}